

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeSorterSort(SortSubtask *pTask,SorterList *pList)

{
  undefined8 *puVar1;
  u8 uVar2;
  uint uVar3;
  SorterCompare p_Var4;
  SorterRecord *pSVar5;
  SorterRecord *pSVar6;
  code *pcVar7;
  SorterRecord *pSVar8;
  SorterRecord **ppSVar9;
  long lVar10;
  SorterRecord *aSlot [64];
  SorterRecord *local_238 [65];
  
  uVar3 = vdbeSortAllocUnpacked(pTask);
  if (uVar3 == 0) {
    pSVar5 = pList->pList;
    uVar2 = pTask->pSorter->typeMask;
    pcVar7 = vdbeSorterCompare;
    if (uVar2 == '\x02') {
      pcVar7 = vdbeSorterCompareText;
    }
    p_Var4 = vdbeSorterCompareInt;
    if (uVar2 != '\x01') {
      p_Var4 = pcVar7;
    }
    pTask->xCompare = p_Var4;
    memset(local_238,0,0x200);
    pSVar8 = local_238[0];
    while (pSVar5 != (SorterRecord *)0x0) {
      pSVar6 = (SorterRecord *)pList->aMemory;
      if (pSVar6 == (SorterRecord *)0x0) {
        pSVar6 = (pSVar5->u).pNext;
      }
      else if (pSVar5 == pSVar6) {
        pSVar6 = (SorterRecord *)0x0;
      }
      else {
        pSVar6 = (SorterRecord *)((long)&pSVar6->nVal + (long)(pSVar5->u).iNext);
      }
      (pSVar5->u).pNext = (SorterRecord *)0x0;
      ppSVar9 = local_238;
      local_238[0] = pSVar8;
      while (pSVar8 != (SorterRecord *)0x0) {
        pSVar5 = vdbeSorterMerge(pTask,pSVar5,pSVar8);
        *ppSVar9 = (SorterRecord *)0x0;
        puVar1 = ppSVar9 + 1;
        ppSVar9 = ppSVar9 + 1;
        pSVar8 = (SorterRecord *)*puVar1;
      }
      *ppSVar9 = pSVar5;
      pSVar5 = pSVar6;
      pSVar8 = local_238[0];
    }
    lVar10 = 0;
    pSVar5 = (SorterRecord *)0x0;
    do {
      pSVar8 = local_238[lVar10];
      pSVar6 = pSVar5;
      if ((pSVar8 != (SorterRecord *)0x0) && (pSVar6 = pSVar8, pSVar5 != (SorterRecord *)0x0)) {
        pSVar6 = vdbeSorterMerge(pTask,pSVar5,pSVar8);
      }
      lVar10 = lVar10 + 1;
      pSVar5 = pSVar6;
    } while (lVar10 != 0x40);
    pList->pList = pSVar6;
    uVar3 = (uint)pTask->pUnpacked->errCode;
  }
  return uVar3;
}

Assistant:

static int vdbeSorterSort(SortSubtask *pTask, SorterList *pList){
  int i;
  SorterRecord *p;
  int rc;
  SorterRecord *aSlot[64];

  rc = vdbeSortAllocUnpacked(pTask);
  if( rc!=SQLITE_OK ) return rc;

  p = pList->pList;
  pTask->xCompare = vdbeSorterGetCompare(pTask->pSorter);
  memset(aSlot, 0, sizeof(aSlot));

  while( p ){
    SorterRecord *pNext;
    if( pList->aMemory ){
      if( (u8*)p==pList->aMemory ){
        pNext = 0;
      }else{
        assert( p->u.iNext<sqlite3MallocSize(pList->aMemory) );
        pNext = (SorterRecord*)&pList->aMemory[p->u.iNext];
      }
    }else{
      pNext = p->u.pNext;
    }

    p->u.pNext = 0;
    for(i=0; aSlot[i]; i++){
      p = vdbeSorterMerge(pTask, p, aSlot[i]);
      aSlot[i] = 0;
    }
    aSlot[i] = p;
    p = pNext;
  }

  p = 0;
  for(i=0; i<ArraySize(aSlot); i++){
    if( aSlot[i]==0 ) continue;
    p = p ? vdbeSorterMerge(pTask, p, aSlot[i]) : aSlot[i];
  }
  pList->pList = p;

  assert( pTask->pUnpacked->errCode==SQLITE_OK
       || pTask->pUnpacked->errCode==SQLITE_NOMEM
  );
  return pTask->pUnpacked->errCode;
}